

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O3

lyd_node * lyd_parse_xml(ly_ctx *ctx,lyxml_elem **root,int options,...)

{
  lyd_node **pplVar1;
  LYS_NODE LVar2;
  lyxml_elem *plVar3;
  unres_data *puVar4;
  char in_AL;
  int iVar5;
  long *plVar6;
  lyd_node *plVar7;
  undefined8 *puVar8;
  lyd_node *plVar9;
  lyd_node *in_RCX;
  char *pcVar10;
  ulong uVar11;
  lyd_node *plVar12;
  LY_ERR no;
  lyd_node *plVar13;
  undefined8 in_R8;
  undefined8 in_R9;
  lyxml_elem *xml;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_168 [24];
  lyd_node *local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  lyd_node *local_b0;
  lyd_node *local_a8;
  char *local_a0;
  lyxml_elem **local_98;
  unres_data *local_90;
  uint local_84;
  lyd_node *local_80;
  lyd_node *act_notif;
  va_list ap;
  lyxml_elem *local_58;
  lyd_node *local_50;
  lyd_node *local_40;
  lyd_node *local_38;
  lyd_node *result;
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  local_38 = (lyd_node *)0x0;
  local_80 = (lyd_node *)0x0;
  local_150 = in_RCX;
  local_148 = in_R8;
  local_140 = in_R9;
  if (ctx == (ly_ctx *)0x0 || root == (lyxml_elem **)0x0) {
    pcVar10 = "Invalid arguments (%s()).";
    ctx = (ly_ctx *)0x0;
  }
  else {
    iVar5 = lyp_data_check_options(ctx,options,"lyd_parse_xml");
    if (iVar5 != 0) {
      return (lyd_node *)0x0;
    }
    if (((options & 0x20U) != 0) || (*root != (lyxml_elem *)0x0)) {
      local_90 = (unres_data *)calloc(1,0x28);
      plVar13 = local_150;
      if (local_90 == (unres_data *)0x0) {
        pcVar10 = "Memory allocation failed (%s()).";
        no = LY_EMEM;
        local_90 = (unres_data *)0x0;
        goto LAB_0013ebd8;
      }
      ap[0].overflow_arg_area = local_168;
      ap[0]._0_8_ = &stack0x00000008;
      act_notif = (lyd_node *)0x3000000018;
      local_98 = root;
      if ((options & 0x20U) == 0) {
        plVar13 = (lyd_node *)0x0;
        plVar7 = (lyd_node *)0x0;
        local_50 = (lyd_node *)0x0;
        goto LAB_0013ec79;
      }
      act_notif = (lyd_node *)0x3000000020;
      if ((local_150 == (lyd_node *)0x0) || (local_150->parent != (lyd_node *)0x0)) {
LAB_0013ed11:
        pcVar10 = "%s: invalid variable parameter (const struct lyd_node *rpc_act).";
LAB_0013f088:
        ly_log(ctx,LY_LLERR,LY_EINVAL,pcVar10,"lyd_parse_xml");
      }
      else {
        LVar2 = local_150->schema->nodetype;
        if ((LVar2 & (LYS_RPC|LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) goto LAB_0013ed11;
        if (LVar2 == LYS_RPC) {
          plVar7 = _lyd_new((lyd_node *)0x0,local_150->schema,0);
          local_50 = plVar7;
LAB_0013ec79:
          if ((options & 0x70U) == 0) {
LAB_0013ed7b:
            plVar12 = (lyd_node *)0x0;
LAB_0013ed7d:
            if (((uint)options >> 0x18 & 1) == 0) {
              local_a0 = (char *)0x0;
            }
            else {
              uVar11 = (ulong)act_notif & 0xffffffff;
              if (uVar11 < 0x29) {
                act_notif = (lyd_node *)CONCAT44(act_notif._4_4_,(int)act_notif + 8);
                puVar8 = (undefined8 *)(uVar11 + (long)ap[0].overflow_arg_area);
              }
              else {
                puVar8 = (undefined8 *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              local_a0 = (char *)*puVar8;
            }
            xml = *local_98;
            if (((uint)options >> 0xc & 1) == 0 && xml != (lyxml_elem *)0x0) {
              plVar3 = xml;
              if (xml->parent == (lyxml_elem *)0x0) {
                do {
                  xml = plVar3;
                  plVar3 = xml->prev;
                } while (xml->prev->next != (lyxml_elem *)0x0);
              }
              else {
                xml = xml->parent->child;
              }
            }
            local_b0 = plVar13;
            local_a8 = plVar12;
            if ((options & 0x10U) == 0) {
LAB_0013ee54:
              local_58 = (lyxml_elem *)0x0;
            }
            else {
              iVar5 = strcmp(xml->name,"action");
              if ((iVar5 == 0) &&
                 (iVar5 = strcmp(xml->ns->value,"urn:ietf:params:xml:ns:yang:1"), iVar5 == 0)) {
                xml = xml->child;
                if (((uint)options >> 10 & 1) == 0) goto LAB_0013ee54;
                local_58 = xml->parent;
              }
              else {
                local_58 = (lyxml_elem *)0x0;
              }
            }
            local_40 = (lyd_node *)0x0;
            plVar13 = (lyd_node *)0x0;
            do {
              if (xml == (lyxml_elem *)0x0) break;
              plVar3 = xml->next;
              iVar5 = xml_parse_data(ctx,xml,plVar7,local_38,plVar13,options,local_90,&local_40,
                                     &local_80,local_a0);
              if (iVar5 != 0) {
                if (local_50 != (lyd_node *)0x0) {
                  local_38 = local_50;
                }
                goto LAB_0013f194;
              }
              local_84 = options;
              if (((uint)options >> 10 & 1) != 0) {
                lyxml_free(ctx,xml);
                *local_98 = plVar3;
              }
              options = local_84;
              if (((local_40 != (lyd_node *)0x0) &&
                  (plVar13 = local_40, options = local_84, (local_84 >> 0x11 & 1) != 0)) &&
                 (options = local_84,
                 local_40->schema->module ==
                 (ctx->models).list[(ulong)ctx->internal_module_count - 1])) {
                options = local_84 & 0xfffdffff;
              }
              if (local_38 == (lyd_node *)0x0) {
                local_38 = local_40;
              }
              xml = plVar3;
            } while (((uint)options >> 0xc & 1) == 0);
            if (local_50 != (lyd_node *)0x0) {
              local_38 = local_50;
            }
            plVar13 = local_38;
            if ((((options & 0x20U) == 0) || (local_b0->schema->nodetype == LYS_RPC)) &&
               (plVar7 = local_80, local_80 == (lyd_node *)0x0 && (options & 0x50U) != 0)) {
              pcVar10 = "action";
              if ((options & 0x10U) == 0) {
                pcVar10 = "notification";
              }
              ly_vlog(ctx,LYE_INELEM,(uint)(local_38 != (lyd_node *)0x0) * 3,local_38,pcVar10);
            }
            else {
              local_80 = plVar7;
              plVar7 = local_80;
              plVar9 = local_38;
              plVar12 = local_38;
              if (((((uint)options >> 0x11 & 1) == 0) ||
                  (plVar9 = ly_ctx_info(ctx), plVar12 = plVar9, plVar13 == (lyd_node *)0x0)) ||
                 (iVar5 = lyd_merge(plVar13,plVar9,0x500), plVar9 = local_38, plVar12 = local_38,
                 iVar5 == 0)) {
                while (local_38 = plVar12, local_40 = plVar9, local_40 != (lyd_node *)0x0) {
                  if ((((local_40->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
                      ((local_40->validity & 1) != 0)) &&
                     (iVar5 = lyv_data_dup(local_40,local_38), iVar5 != 0)) goto LAB_0013f194;
                  plVar7 = local_80;
                  plVar12 = local_38;
                  plVar9 = local_40->next;
                }
                iVar5 = lyd_defaults_add_unres
                                  (&local_38,options,ctx,(lys_module **)0x0,0,local_a8,plVar7,
                                   local_90,1);
                if (iVar5 == 0) {
                  if ((options & 0x2080U) != 0) {
LAB_0013f1dc:
                    if (local_58 != (lyxml_elem *)0x0) {
                      lyxml_free(ctx,local_58);
                    }
                    puVar4 = local_90;
                    free(local_90->node);
                    free(puVar4->type);
                    free(puVar4);
                    return local_38;
                  }
                  plVar13 = local_80;
                  if (local_80 == (lyd_node *)0x0) {
                    plVar13 = local_38;
                  }
                  iVar5 = lyd_check_mandatory_tree(plVar13,ctx,(lys_module **)0x0,0,options);
                  if (iVar5 == 0) goto LAB_0013f1dc;
                }
              }
              else {
                ly_log(ctx,LY_LLERR,LY_EINT,"Adding ietf-yang-library data failed.");
              }
            }
LAB_0013f194:
            lyd_free_withsiblings(local_38);
            if (local_58 != (lyxml_elem *)0x0) {
              lyxml_free(ctx,local_58);
            }
            goto LAB_0013f1ae;
          }
          uVar11 = (ulong)act_notif & 0xffffffff;
          if (uVar11 < 0x29) {
            act_notif = (lyd_node *)CONCAT44(act_notif._4_4_,(int)act_notif + 8);
            plVar6 = (long *)(uVar11 + (long)ap[0].overflow_arg_area);
          }
          else {
            plVar6 = (long *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          plVar9 = (lyd_node *)*plVar6;
          if (plVar9 == (lyd_node *)0x0) goto LAB_0013ed7b;
          plVar12 = plVar9;
          if (-1 < (short)options) {
            do {
              if (plVar12->parent != (lyd_node *)0x0) {
                pcVar10 = "%s: invalid variable parameter (const struct lyd_node *data_tree).";
                local_40 = plVar12;
                goto LAB_0013f088;
              }
              pplVar1 = &plVar12->next;
              plVar12 = *pplVar1;
            } while (*pplVar1 != (lyd_node *)0x0);
            local_40 = (lyd_node *)0x0;
            do {
              plVar12 = plVar9;
              plVar9 = plVar12->prev;
            } while (plVar12->prev->next != (lyd_node *)0x0);
            if (((uint)options >> 0xc & 1) != 0) {
              pcVar10 = 
              "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
              ;
              goto LAB_0013f088;
            }
            goto LAB_0013ed7d;
          }
          pcVar10 = 
          "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
          ;
          goto LAB_0013f088;
        }
        local_50 = lyd_dup(local_150,1);
        local_40 = local_50;
        if (local_50 != (lyd_node *)0x0) {
          LVar2 = local_50->schema->nodetype;
          plVar7 = local_50;
          while (local_40 = plVar7, LVar2 != LYS_ACTION) {
            if ((LVar2 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
              local_40 = plVar7->child;
              if (local_40 == (lyd_node *)0x0) goto LAB_0013f250;
            }
            else {
              local_40 = (lyd_node *)0x0;
LAB_0013f250:
              if (plVar7 == local_50) break;
              local_40 = plVar7->next;
              if (local_40 == (lyd_node *)0x0) {
                plVar7 = plVar7->parent;
                do {
                  if (plVar7->parent == local_50->parent) goto LAB_0013f2b1;
                  local_40 = plVar7->next;
                  plVar7 = plVar7->parent;
                } while (local_40 == (lyd_node *)0x0);
              }
            }
            plVar7 = local_40;
            LVar2 = local_40->schema->nodetype;
          }
          lyd_free_withsiblings(plVar7->child);
          goto LAB_0013ec79;
        }
LAB_0013f2b1:
        ly_log(ctx,LY_LLERR,LY_EINVAL,
               "%s: invalid variable parameter (const struct lyd_node *rpc_act).","lyd_parse_xml");
        lyd_free_withsiblings(local_50);
      }
      lyd_free_withsiblings(local_38);
LAB_0013f1ae:
      puVar4 = local_90;
      free(local_90->node);
      free(puVar4->type);
      free(puVar4);
      return (lyd_node *)0x0;
    }
    if ((options & 0x50U) == 0) {
      lyd_validate(&local_38,options,ctx);
      return local_38;
    }
    pcVar10 = "%s: *root identifies RPC/Notification so it cannot be NULL.";
  }
  no = LY_EINVAL;
LAB_0013ebd8:
  ly_log(ctx,LY_LLERR,no,pcVar10,"lyd_parse_xml");
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_parse_xml(struct ly_ctx *ctx, struct lyxml_elem **root, int options, ...)
{
    va_list ap;
    int r;
    struct unres_data *unres = NULL;
    const struct lyd_node *rpc_act = NULL, *data_tree = NULL;
    struct lyd_node *result = NULL, *iter, *last, *reply_parent = NULL, *reply_top = NULL, *act_notif = NULL;
    struct lyxml_elem *xmlstart, *xmlelem, *xmlaux, *xmlfree = NULL;
    const char *yang_data_name = NULL;

    if (!ctx || !root) {
        LOGARG;
        return NULL;
    }

    if (lyp_data_check_options(ctx, options, __func__)) {
        return NULL;
    }

    if (!(*root) && !(options & LYD_OPT_RPCREPLY)) {
        /* empty tree */
        if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) {
            /* error, top level node identify RPC and Notification */
            LOGERR(ctx, LY_EINVAL, "%s: *root identifies RPC/Notification so it cannot be NULL.", __func__);
            return NULL;
        } else if (!(options & LYD_OPT_RPCREPLY)) {
            /* others - no work is needed, just check for missing mandatory nodes */
            lyd_validate(&result, options, ctx);
            return result;
        }
        /* continue with empty RPC reply, for which we need RPC */
    }

    unres = calloc(1, sizeof *unres);
    LY_CHECK_ERR_RETURN(!unres, LOGMEM(ctx), NULL);

    va_start(ap, options);
    if (options & LYD_OPT_RPCREPLY) {
        rpc_act = va_arg(ap, const struct lyd_node *);
        if (!rpc_act || rpc_act->parent || !(rpc_act->schema->nodetype & (LYS_RPC | LYS_LIST | LYS_CONTAINER))) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
            goto error;
        }
        if (rpc_act->schema->nodetype == LYS_RPC) {
            /* RPC request */
            reply_top = reply_parent = _lyd_new(NULL, rpc_act->schema, 0);
        } else {
            /* action request */
            reply_top = lyd_dup(rpc_act, 1);
            LY_TREE_DFS_BEGIN(reply_top, iter, reply_parent) {
                if (reply_parent->schema->nodetype == LYS_ACTION) {
                    break;
                }
                LY_TREE_DFS_END(reply_top, iter, reply_parent);
            }
            if (!reply_parent) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
                lyd_free_withsiblings(reply_top);
                goto error;
            }
            lyd_free_withsiblings(reply_parent->child);
        }
    }
    if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF | LYD_OPT_RPCREPLY)) {
        data_tree = va_arg(ap, const struct lyd_node *);
        if (data_tree) {
            if (options & LYD_OPT_NOEXTDEPS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set).",
                       __func__);
                goto error;
            }

            LY_TREE_FOR((struct lyd_node *)data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    goto error;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);

            /* LYD_OPT_NOSIBLINGS cannot be set in this case */
            if (options & LYD_OPT_NOSIBLINGS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
                goto error;
            }
        }
    }
    if (options & LYD_OPT_DATA_TEMPLATE) {
        yang_data_name = va_arg(ap, const char *);
    }

    if ((*root) && !(options & LYD_OPT_NOSIBLINGS)) {
        /* locate the first root to process */
        if ((*root)->parent) {
            xmlstart = (*root)->parent->child;
        } else {
            xmlstart = *root;
            while(xmlstart->prev->next) {
                xmlstart = xmlstart->prev;
            }
        }
    } else {
        xmlstart = *root;
    }

    if ((options & LYD_OPT_RPC)
            && !strcmp(xmlstart->name, "action") && !strcmp(xmlstart->ns->value, "urn:ietf:params:xml:ns:yang:1")) {
        /* it's an action, not a simple RPC */
        xmlstart = xmlstart->child;
        if (options & LYD_OPT_DESTRUCT) {
            /* free it later */
            xmlfree = xmlstart->parent;
        }
    }

    iter = last = NULL;
    LY_TREE_FOR_SAFE(xmlstart, xmlaux, xmlelem) {
        r = xml_parse_data(ctx, xmlelem, reply_parent, result, last, options, unres, &iter, &act_notif, yang_data_name);
        if (r) {
            if (reply_top) {
                result = reply_top;
            }
            goto error;
        } else if (options & LYD_OPT_DESTRUCT) {
            lyxml_free(ctx, xmlelem);
            *root = xmlaux;
        }
        if (iter) {
            last = iter;
            if ((options & LYD_OPT_DATA_ADD_YANGLIB) && iter->schema->module == ctx->models.list[ctx->internal_module_count - 1]) {
                /* ietf-yang-library data present, so ignore the option to add them */
                options &= ~LYD_OPT_DATA_ADD_YANGLIB;
            }
        }
        if (!result) {
            result = iter;
        }

        if (options & LYD_OPT_NOSIBLINGS) {
            /* stop after the first processed root */
            break;
        }
    }

    if (reply_top) {
        result = reply_top;
    }

    if ((options & LYD_OPT_RPCREPLY) && (rpc_act->schema->nodetype != LYS_RPC)) {
        /* action reply */
        act_notif = reply_parent;
    } else if ((options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) && !act_notif) {
        LOGVAL(ctx, LYE_INELEM, (result ? LY_VLOG_LYD : LY_VLOG_NONE), result, (options & LYD_OPT_RPC ? "action" : "notification"));
        goto error;
    }

    /* add missing ietf-yang-library if requested */
    if (options & LYD_OPT_DATA_ADD_YANGLIB) {
        if (!result) {
            result = ly_ctx_info(ctx);
        } else if (lyd_merge(result, ly_ctx_info(ctx), LYD_OPT_DESTRUCT | LYD_OPT_EXPLICIT)) {
            LOGERR(ctx, LY_EINT, "Adding ietf-yang-library data failed.");
            goto error;
        }
    }

    /* check for uniqueness of top-level lists/leaflists because
     * only the inner instances were tested in lyv_data_content() */
    LY_TREE_FOR(result, iter) {
        if (!(iter->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(iter->validity & LYD_VAL_DUP)) {
            continue;
        }

        if (lyv_data_dup(iter, result)) {
            goto error;
        }
    }

    /* add default values, resolve unres and check for mandatory nodes in final tree */
    if (lyd_defaults_add_unres(&result, options, ctx, NULL, 0, data_tree, act_notif, unres, 1)) {
        goto error;
    }
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER))
            && lyd_check_mandatory_tree((act_notif ? act_notif : result), ctx, NULL, 0, options)) {
        goto error;
    }

    if (xmlfree) {
        lyxml_free(ctx, xmlfree);
    }
    free(unres->node);
    free(unres->type);
    free(unres);
    va_end(ap);
    return result;

error:
    lyd_free_withsiblings(result);
    if (xmlfree) {
        lyxml_free(ctx, xmlfree);
    }
    free(unres->node);
    free(unres->type);
    free(unres);
    va_end(ap);
    return NULL;
}